

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue>,_false>
__thiscall
duckdb::make_unsafe_uniq_array_uninitialized<duckdb::ApproxTopKValue>(duckdb *this,size_t n)

{
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x38),8) == 0) {
    uVar4 = SUB168(auVar1 * ZEXT816(0x38),0);
  }
  puVar2 = (undefined8 *)operator_new__(uVar4);
  if (n != 0) {
    puVar3 = puVar2;
    do {
      *(undefined4 *)(puVar3 + 2) = 0;
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3[6] = 0;
      puVar3[4] = 0;
      puVar3[5] = 0;
      puVar3 = puVar3 + 7;
    } while (puVar3 != puVar2 + n * 7);
  }
  *(undefined8 **)this = puVar2;
  return (unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>)
         (unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>)
         this;
}

Assistant:

inline unique_ptr<DATA_TYPE[], std::default_delete<DATA_TYPE>, false>
make_unsafe_uniq_array_uninitialized(size_t n) // NOLINT: mimic std style
{
	return unique_ptr<DATA_TYPE[], std::default_delete<DATA_TYPE>, false>(new DATA_TYPE[n]);
}